

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O0

void __thiscall BigInteger::multiply(BigInteger *this,uint a)

{
  uint uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  reference pvVar4;
  uint in_ESI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  bool bVar5;
  longlong new_carry;
  size_t i;
  longlong carry;
  undefined4 in_stack_ffffffffffffffa8;
  value_type in_stack_ffffffffffffffac;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  long local_18;
  
  local_18 = 0;
  local_20 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  while( true ) {
    bVar5 = true;
    if (local_18 == 0) {
      pvVar2 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
      bVar5 = local_20 < pvVar2;
    }
    if (!bVar5) break;
    pvVar2 = local_20;
    pvVar3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
    if (pvVar3 <= pvVar2) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (pvVar2,(value_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
      ;
    }
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(size_type)local_20);
    uVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(size_type)local_20);
    in_stack_ffffffffffffffac =
         (value_type)((long)((ulong)*pvVar4 * (ulong)in_ESI + local_18) % 1000000000);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(size_type)local_20);
    *pvVar4 = in_stack_ffffffffffffffac;
    local_20 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(local_20->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
    local_18 = (long)((ulong)uVar1 * (ulong)in_ESI + local_18) / 1000000000;
  }
  return;
}

Assistant:

void BigInteger::multiply(unsigned a) noexcept
{
    long long carry = 0;
    for(size_t i = 0; carry || i < digits.size(); i++)
    {
        if(i >= digits.size())
            digits.push_back(0);
        long long new_carry = (digits[i] * 1ll * a + carry) / BLOCK_MOD;
        digits[i] = (digits[i] * 1ll * a + carry) % BLOCK_MOD;
        carry = new_carry;
    }
}